

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

void __thiscall Highs::invalidateSolverData(Highs *this)

{
  this->model_status_ = kMin;
  (this->info_).super_HighsInfoStruct.primal_solution_status = 0;
  (this->info_).super_HighsInfoStruct.dual_solution_status = 0;
  (this->info_).super_HighsInfoStruct.num_primal_infeasibilities = -1;
  (this->info_).super_HighsInfoStruct.max_primal_infeasibility = INFINITY;
  (this->info_).super_HighsInfoStruct.sum_primal_infeasibilities = INFINITY;
  (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = -1;
  (this->info_).super_HighsInfoStruct.max_dual_infeasibility = INFINITY;
  (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities = INFINITY;
  HighsSolution::invalidate(&this->solution_);
  (this->info_).super_HighsInfoStruct.basis_validity = 0;
  HighsBasis::invalidate(&this->basis_);
  HighsRanging::invalidate(&this->ranging_);
  HighsInfo::invalidate(&this->info_);
  HEkk::invalidate(&this->ekk_instance_);
  HighsIis::invalidate(&this->iis_);
  return;
}

Assistant:

void Highs::invalidateSolverData() {
  invalidateModelStatus();
  invalidateSolution();
  invalidateBasis();
  invalidateRanging();
  invalidateInfo();
  invalidateEkk();
  invalidateIis();
}